

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O0

void dump_objects(ang_file *fff)

{
  char *pcVar1;
  char local_98 [8];
  char name [120];
  object_kind *kind;
  wchar_t i;
  ang_file *fff_local;
  
  file_putf(fff,"# Objects\n");
  for (kind._4_4_ = 0; kind._4_4_ < (int)(uint)z_info->k_max; kind._4_4_ = kind._4_4_ + 1) {
    name._112_8_ = k_info + kind._4_4_;
    memset(local_98,0,0x78);
    if ((*(long *)name._112_8_ != 0) && (*(int *)(name._112_8_ + 0x24) != 0)) {
      object_short_name(local_98,0x78,*(char **)name._112_8_);
      pcVar1 = tval_find_name(*(wchar_t *)(name._112_8_ + 0x24));
      file_putf(fff,"object:%s:%s:%d:%d\n",pcVar1,local_98,(ulong)kind_x_attr[kind._4_4_],
                (ulong)(uint)kind_x_char[kind._4_4_]);
    }
  }
  return;
}

Assistant:

void dump_objects(ang_file *fff)
{
	int i;

	file_putf(fff, "# Objects\n");

	for (i = 0; i < z_info->k_max; i++) {
		struct object_kind *kind = &k_info[i];
		char name[120] = "";

		if (!kind->name || !kind->tval) continue;

		object_short_name(name, sizeof name, kind->name);
		file_putf(fff, "object:%s:%s:%d:%d\n", tval_find_name(kind->tval),
				name, kind_x_attr[i], kind_x_char[i]);
	}
}